

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

Configuration *
rc::detail::configFromString
          (Configuration *__return_storage_ptr__,string *str,Configuration *defaults)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  const_iterator cVar3;
  ConfigurationException *this;
  _func_bool_bool_ptr *in_R8;
  allocator local_352;
  allocator local_351;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
  value_1;
  string local_318 [32];
  __node_base *local_2f8;
  size_type local_2f0;
  char local_2e8 [8];
  size_type sStack_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  string local_2a8;
  string local_288;
  unsigned_long value;
  key_type local_248;
  string local_228;
  string local_208;
  string local_1e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1c8 [7];
  
  parseMap((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_2d8,str);
  Configuration::Configuration(__return_storage_ptr__,defaults);
  std::__cxx11::string::string((string *)&value_1,"seed",(allocator *)&local_288);
  std::__cxx11::string::string
            ((string *)&local_2f8,"\'seed\' must be a valid integer",(allocator *)&local_2a8);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_2d8,(key_type *)&value_1);
  p_Var1 = &local_2d8._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1c8,(string *)(cVar3._M_node + 2),_S_in);
    std::istream::_M_extract<unsigned_long>((ulong *)local_1c8);
    bVar2 = *(byte *)((long)&local_1c8[0]._M_buckets[-3]->_M_nxt +
                     (long)&local_1c8[0]._M_rehash_policy._M_max_load_factor);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1c8);
    if ((bVar2 & 5) != 0) {
      this = (ConfigurationException *)__cxa_allocate_exception(0x28);
      local_1c8[0]._M_buckets = &local_1c8[0]._M_before_begin._M_nxt;
      if (local_2f8 == (__node_base *)local_2e8) {
        local_1c8[0]._M_element_count = sStack_2e0;
      }
      else {
        local_1c8[0]._M_buckets = &local_2f8->_M_nxt;
      }
      local_1c8[0]._M_bucket_count = local_2f0;
      local_2f0 = 0;
      local_2e8[0] = '\0';
      local_2f8 = (__node_base *)local_2e8;
      ConfigurationException::ConfigurationException(this,(string *)local_1c8);
      __cxa_throw(this,&ConfigurationException::typeinfo,
                  ConfigurationException::~ConfigurationException);
    }
    (__return_storage_ptr__->testParams).seed = value;
  }
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&value_1);
  std::__cxx11::string::string((string *)local_1c8,"max_success",(allocator *)&value_1);
  std::__cxx11::string::string
            ((string *)&value,"\'max_success\' must be a valid non-negative integer",
             (allocator *)&local_288);
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,(string *)local_1c8,&(__return_storage_ptr__->testParams).maxSuccess,
             (string *)&value,(_func_bool_int *)in_R8);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string((string *)local_1c8,"max_size",(allocator *)&value_1);
  std::__cxx11::string::string
            ((string *)&local_288,"\'max_size\' must be a valid non-negative integer",
             (allocator *)&local_2a8);
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,(string *)local_1c8,&(__return_storage_ptr__->testParams).maxSize,
             &local_288,(_func_bool_int *)in_R8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string((string *)local_1c8,"max_discard_ratio",(allocator *)&value_1);
  std::__cxx11::string::string
            ((string *)&local_2a8,"\'max_discard_ratio\' must be a valid non-negative integer",
             (allocator *)&local_1e8);
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,(string *)local_1c8,&(__return_storage_ptr__->testParams).maxDiscardRatio
             ,&local_2a8,(_func_bool_int *)in_R8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string((string *)local_1c8,"noshrink",(allocator *)&value_1);
  std::__cxx11::string::string
            ((string *)&local_1e8,"\'noshrink\' must be either \'1\' or \'0\'",
             (allocator *)&local_208);
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,(string *)local_1c8,
             &(__return_storage_ptr__->testParams).disableShrinking,&local_1e8,in_R8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string((string *)local_1c8,"verbose_progress",(allocator *)&value_1);
  std::__cxx11::string::string
            ((string *)&local_208,"\'verbose_progress\' must be either \'1\' or \'0\'",
             (allocator *)&local_228);
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,(string *)local_1c8,&__return_storage_ptr__->verboseProgress,&local_208,
             in_R8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string((string *)local_1c8,"verbose_shrinking",(allocator *)&value_1);
  std::__cxx11::string::string
            ((string *)&local_228,"\'verbose_shrinking\' must be either \'1\' or \'0\'",
             (allocator *)&local_248);
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,(string *)local_1c8,&__return_storage_ptr__->verboseShrinking,&local_228,
             in_R8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string((string *)&local_248,"reproduce",&local_351);
  std::__cxx11::string::string(local_318,"\'reproduce\' string has invalid format",&local_352);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_2d8,&local_248);
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    value_1._M_h._M_buckets = &value_1._M_h._M_single_bucket;
    value_1._M_h._M_bucket_count = 1;
    value_1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    value_1._M_h._M_element_count = 0;
    value_1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    value_1._M_h._M_rehash_policy._M_next_resize = 0;
    value_1._M_h._M_single_bucket = (__node_base_ptr)0x0;
    stringToReproduceMap
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
                *)local_1c8,(string *)(cVar3._M_node + 2));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&value_1._M_h,local_1c8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_1c8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(__return_storage_ptr__->reproduce)._M_h,&value_1._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&value_1._M_h);
  }
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string((string *)&local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2d8);
  return __return_storage_ptr__;
}

Assistant:

Configuration configFromString(const std::string &str,
                               const Configuration &defaults) {
  try {
    return configFromMap(parseMap(str), defaults);
  } catch (const ParseException &e) {
    throw ConfigurationException(
        std::string("Failed to parse configuration string -- ") + e.what());
  }
}